

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall
Centaurus::NFA<unsigned_char>::add_state(NFA<unsigned_char> *this,CharClass<unsigned_char> *cc)

{
  pointer pNVar1;
  
  pNVar1 = (this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
           super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  NFABaseState<unsigned_char,_int>::add_transition
            (pNVar1 + -1,cc,
             (int)(((long)pNVar1 -
                   (long)(this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).
                         m_states.
                         super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x28),false);
  std::
  vector<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
  ::emplace_back<>(&(this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states);
  return;
}

Assistant:

void add_state(const CharClass<TCHAR>& cc)
    {
        m_states.back().add_transition(cc, m_states.size());
        m_states.emplace_back();
    }